

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Segment::MoveCuesBeforeClusters(Segment *this)

{
  int32_t iVar1;
  uint32_t uVar2;
  CuePoint *this_00;
  uint64_t uVar3;
  uint64_t uVar4;
  int local_34;
  int local_30;
  int32_t i_2;
  int32_t cues_index;
  int32_t cluster_index;
  int32_t i_1;
  int32_t i;
  uint64_t cue_size;
  uint64_t current_cue_size;
  Segment *this_local;
  
  current_cue_size = (uint64_t)this;
  cue_size = Cues::Size(&this->cues_);
  _i_1 = 0;
  cluster_index = 0;
  while( true ) {
    iVar1 = Cues::cue_entries_size(&this->cues_);
    if (iVar1 <= cluster_index) break;
    this_00 = Cues::GetCueByIndex(&this->cues_,cluster_index);
    uVar3 = CuePoint::Size(this_00);
    _i_1 = uVar3 + _i_1;
    cluster_index = cluster_index + 1;
  }
  cues_index = 0;
  while( true ) {
    iVar1 = Cues::cue_entries_size(&this->cues_);
    if (iVar1 <= cues_index) break;
    MoveCuesBeforeClustersHelper(this,cue_size,cues_index,(uint64_t *)&i_1);
    cues_index = cues_index + 1;
  }
  i_2 = 0;
  local_30 = 0;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    uVar2 = SeekHead::GetId(&this->seek_head_,local_34);
    if (uVar2 == 0x1f43b675) {
      i_2 = local_34;
    }
    uVar2 = SeekHead::GetId(&this->seek_head_,local_34);
    if (uVar2 == 0x1c53bb6b) {
      local_30 = local_34;
    }
  }
  uVar3 = SeekHead::GetPosition(&this->seek_head_,i_2);
  SeekHead::SetSeekEntry(&this->seek_head_,local_30,0x1c53bb6b,uVar3);
  uVar3 = Cues::Size(&this->cues_);
  uVar4 = SeekHead::GetPosition(&this->seek_head_,local_30);
  SeekHead::SetSeekEntry(&this->seek_head_,i_2,0x1f43b675,uVar3 + uVar4);
  return;
}

Assistant:

void Segment::MoveCuesBeforeClusters() {
  const uint64_t current_cue_size = cues_.Size();
  uint64_t cue_size = 0;
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    cue_size += cues_.GetCueByIndex(i)->Size();
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    MoveCuesBeforeClustersHelper(current_cue_size, i, &cue_size);

  // Adjust the Seek Entry to reflect the change in position
  // of Cluster and Cues
  int32_t cluster_index = 0;
  int32_t cues_index = 0;
  for (int32_t i = 0; i < SeekHead::kSeekEntryCount; ++i) {
    if (seek_head_.GetId(i) == libwebm::kMkvCluster)
      cluster_index = i;
    if (seek_head_.GetId(i) == libwebm::kMkvCues)
      cues_index = i;
  }
  seek_head_.SetSeekEntry(cues_index, libwebm::kMkvCues,
                          seek_head_.GetPosition(cluster_index));
  seek_head_.SetSeekEntry(cluster_index, libwebm::kMkvCluster,
                          cues_.Size() + seek_head_.GetPosition(cues_index));
}